

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  TString *pTVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  TValue *io1;
  TValue *io2;
  TString *x__1;
  TValue *io_1;
  TString *x_;
  TValue *io;
  StkId oldtop_local;
  int errcode_local;
  lua_State *L_local;
  
  if (errcode == 4) {
    pTVar1 = L->l_G->memerrmsg;
    (oldtop->value_).f = (lua_CFunction)pTVar1;
    oldtop->tt_ = (pTVar1->tsv).tt | 0x40;
  }
  else if (errcode == 6) {
    pGVar3 = (GCObject *)luaS_newlstr(L,"error in error handling",0x17);
    (oldtop->value_).gc = pGVar3;
    oldtop->tt_ = (pGVar3->gch).tt | 0x40;
  }
  else {
    pTVar2 = L->top;
    oldtop->value_ = pTVar2[-1].value_;
    oldtop->tt_ = pTVar2[-1].tt_;
  }
  L->top = oldtop + 1;
  return;
}

Assistant:

static void seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {  /* memory error? */
      setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
    default: {
      setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
      break;
    }
  }
  L->top = oldtop + 1;
}